

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

int __thiscall Pathie::Path::rmdir(Path *this,char *__path)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ErrnoError *this_00;
  int *piVar3;
  string nstr;
  string local_30;
  
  utf8_to_filename(&local_30,&this->m_path);
  iVar1 = ::rmdir(local_30._M_dataplus._M_p);
  if (-1 < iVar1) {
    paVar2 = &local_30.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar2) {
      operator_delete(local_30._M_dataplus._M_p);
      paVar2 = extraout_RAX;
    }
    return (int)paVar2;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar3 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar3);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::rmdir() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (::rmdir(nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);
  if (_wrmdir(utf16.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif
}